

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void invoke_prog_explosives(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  
  if (0 < obj->timer) {
    send_to_char("The fuse is already set.\n\r",ch);
    return;
  }
  bVar1 = is_number(argument);
  if (bVar1) {
    iVar2 = atoi(argument);
    if (0xffffffcf < iVar2 - 0x31U) {
      act("$n sets the fuse of $p, and it begins to tick.",ch,obj,(void *)0x0,0);
      act("You set the fuse of $p, and it begins to tick.",ch,obj,(void *)0x0,3);
      obj->timer = (short)iVar2;
      return;
    }
    if (iVar2 == 0) {
      act("$n sets $p and stuffs it in $s mouth!",ch,obj,(void *)0x0,0);
      act("You set $p and stuff it in your mouth!",ch,obj,(void *)0x0,3);
      unequip_char(ch,obj,true);
      bag_explode(ch,obj,3);
      return;
    }
  }
  act("$n fumbles awkwardly with $p, and it begins to tick.",ch,obj,(void *)0x0,0);
  act("You fumble awkwardly with $p, and it begins to tick.",ch,obj,(void *)0x0,3);
  iVar2 = number_range(2,0x30);
  obj->timer = (short)iVar2;
  return;
}

Assistant:

void invoke_prog_explosives(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	int fuse;

	if (obj->timer > 0)
	{
		send_to_char("The fuse is already set.\n\r", ch);
		return;
	}

	if (is_number(argument))
	{
		fuse = atoi(argument);

		if (fuse < 1 || fuse > 48)
		{
			if (fuse == 0)
			{
				act("$n sets $p and stuffs it in $s mouth!", ch, obj, 0, TO_ROOM);
				act("You set $p and stuff it in your mouth!", ch, obj, 0, TO_CHAR);

				unequip_char(ch, obj, true);
				bag_explode(ch, obj, 3);
				return;
			}

			act("$n fumbles awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_ROOM);
			act("You fumble awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_CHAR);
		}
		else
		{
			act("$n sets the fuse of $p, and it begins to tick.", ch, obj, 0, TO_ROOM);
			act("You set the fuse of $p, and it begins to tick.", ch, obj, 0, TO_CHAR);

			obj->timer = fuse;
			return;
		}
	}
	else
	{
		act("$n fumbles awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_ROOM);
		act("You fumble awkwardly with $p, and it begins to tick.", ch, obj, 0, TO_CHAR);
	}

	fuse = number_range(2, 48);
	obj->timer = fuse;
}